

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O3

void __thiscall
icu_63::NumeratorSubstitution::NumeratorSubstitution
          (NumeratorSubstitution *this,int32_t _pos,double _denominator,NFRuleSet *_ruleSet,
          UnicodeString *description,UErrorCode *status)

{
  short sVar1;
  int8_t iVar2;
  int64_t iVar3;
  int iVar4;
  int32_t iVar5;
  UnicodeString local_70;
  
  sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar5 = (description->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
  }
  iVar2 = UnicodeString::doCompare
                    (description,iVar5 + -2,2,
                     L"<<㙎捩彵㌶ㄲ慓敭慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟ㄳ临卆扵瑳瑩瑵潩䕮一椶畣㙟㈳䴲汵楴汰敩卲扵瑳瑩瑵潩䕮一椶畣㙟ㄳ䴹摯汵獵畓獢楴畴楴湯E㙎捩彵㌶㐲湉整牧污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㘲牆捡楴湯污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㔲扁潳畬整慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟㈳丱浵牥瑡牯畓獢楴畴楴湯E搳\xfff3摧\xfff3摆\xfff3摕\xfff3敖\xfff3斖\xfff3攡\xfff3斖\xfff3斖\xfff3斖\xfff3敖\xfff3斖\xfff3敖\xfff3梀\xfff3槸\xfff3棬\xfff3梾\xfff3棋\xfff3梩\xfff3棿\xfff3椔\xfff3棠\xfff3椥\xfff3樵\xfff3樕\xfff3桴\xfff3樕\xfff3樕\xfff3樕\xfff3橅\xfff3樕\xfff3樥\xfff3椵\xfff3椵\xfff3椼\xfff3榛\xfff3楹\xfff3榊\xfff3楆\xfff3楨\xfff3楗\xfff3㙎捩彵㌶渶浵敢㑲浩汰㌱潔敫䍮湯畳敭䕲一椶畣㙟㘳畮扭牥椴灭ㅬ匴浹潢偬潲楶敤䕲"
                     ,0,2);
  if (iVar2 == '\0') {
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (description->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    UnicodeString::UnicodeString(&local_70,description,0,iVar4 + -1);
  }
  else {
    UnicodeString::UnicodeString(&local_70,description);
  }
  NFSubstitution::NFSubstitution(&this->super_NFSubstitution,_pos,_ruleSet,&local_70,status);
  UnicodeString::~UnicodeString(&local_70);
  (this->super_NFSubstitution).super_UObject._vptr_UObject =
       (_func_int **)&PTR__NumeratorSubstitution_003f1150;
  this->denominator = _denominator;
  iVar3 = util64_fromDouble(_denominator);
  this->ldenominator = iVar3;
  sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar5 = (description->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
  }
  iVar2 = UnicodeString::doCompare
                    (description,iVar5 + -2,2,
                     L"<<㙎捩彵㌶ㄲ慓敭慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟ㄳ临卆扵瑳瑩瑵潩䕮一椶畣㙟㈳䴲汵楴汰敩卲扵瑳瑩瑵潩䕮一椶畣㙟ㄳ䴹摯汵獵畓獢楴畴楴湯E㙎捩彵㌶㐲湉整牧污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㘲牆捡楴湯污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㔲扁潳畬整慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟㈳丱浵牥瑡牯畓獢楴畴楴湯E搳\xfff3摧\xfff3摆\xfff3摕\xfff3敖\xfff3斖\xfff3攡\xfff3斖\xfff3斖\xfff3斖\xfff3敖\xfff3斖\xfff3敖\xfff3梀\xfff3槸\xfff3棬\xfff3梾\xfff3棋\xfff3梩\xfff3棿\xfff3椔\xfff3棠\xfff3椥\xfff3樵\xfff3樕\xfff3桴\xfff3樕\xfff3樕\xfff3樕\xfff3橅\xfff3樕\xfff3樥\xfff3椵\xfff3椵\xfff3椼\xfff3榛\xfff3楹\xfff3榊\xfff3楆\xfff3楨\xfff3楗\xfff3㙎捩彵㌶渶浵敢㑲浩汰㌱潔敫䍮湯畳敭䕲一椶畣㙟㘳畮扭牥椴灭ㅬ匴浹潢偬潲楶敤䕲"
                     ,0,2);
  this->withZeros = iVar2 == '\0';
  return;
}

Assistant:

NumeratorSubstitution(int32_t _pos,
        double _denominator,
        NFRuleSet* _ruleSet,
        const UnicodeString& description,
        UErrorCode& status)
        : NFSubstitution(_pos, _ruleSet, fixdesc(description), status), denominator(_denominator) 
    {
        ldenominator = util64_fromDouble(denominator);
        withZeros = description.endsWith(LTLT, 2);
    }